

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O1

void path_remove(path_state_t *state)

{
  list_node_t *plVar1;
  
  plVar1 = (state->path_list).tail;
  free(plVar1->data);
  list_del(&state->path_list,plVar1);
  if ((state->path_list).head == (list_node_t *)0x0) {
    path_remove_cold_1();
    plVar1 = (list_node_t *)&state->path_list;
    while (plVar1 = plVar1->next, plVar1 != (list_node_t *)0x0) {
      free(plVar1->data);
    }
    list_free_nodes(&state->path_list);
    return;
  }
  return;
}

Assistant:

void
path_remove(
    path_state_t* state)
{
    list_node_t* node = state->path_list.tail;
    free(node->data);
    list_del(&state->path_list, node);
    if (state->path_list.head == NULL) {
        fprintf(stderr, "%s: removed last element from path\n", state->program_name);
        exit(1);
    }
}